

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O0

CURLcode ftp_state_use_port(Curl_easy *data,ftpport fcmd)

{
  undefined2 uVar1;
  Curl_easy *pCVar2;
  uint16_t uVar3;
  uint remote_scope;
  if2ip_result_t iVar4;
  int iVar5;
  CURLcode CVar6;
  size_t sVar7;
  char *pcVar8;
  ulong uVar9;
  int *piVar10;
  undefined8 uVar11;
  char *local_7c8;
  char *local_7b0;
  char *local_770;
  char **local_738;
  char *dest;
  char *source;
  char target [67];
  char *local_6c0;
  char *r;
  char *port_start;
  char *port_sep;
  char *ip_start;
  char *ip_end;
  char ipstr [50];
  ulong local_658;
  size_t addrlen;
  char *addr;
  char buffer [256];
  _Bool possibly_non_local;
  unsigned_short port;
  unsigned_short port_max;
  Curl_dns_entry *pCStack_540;
  unsigned_short port_min;
  Curl_dns_entry *dns_entry;
  char *string_ftpport;
  char *host;
  int error;
  resolve_t rc;
  sockaddr_in6 *sa6;
  sockaddr_in *sa4;
  sockaddr *sa;
  char hbuf [1025];
  socklen_t local_fc;
  Curl_addrinfo *pCStack_f8;
  curl_socklen_t sslen;
  Curl_addrinfo *ai;
  Curl_addrinfo *res;
  Curl_sockaddr_storage ss;
  char myhost [47];
  curl_socket_t local_2c;
  pingpong *ppStack_28;
  curl_socket_t portsock;
  ftp_conn *ftpc;
  connectdata *conn;
  CURLcode result;
  ftpport fcmd_local;
  Curl_easy *data_local;
  
  conn._0_4_ = CURLE_FTP_PORT_FAILED;
  ftpc = (ftp_conn *)data->conn;
  ppStack_28 = (pingpong *)&((connectdata *)ftpc)->proto;
  local_2c = -1;
  conn._4_4_ = fcmd;
  _result = data;
  memset((void *)((long)&ss.buffer + 0x78),0,0x2f);
  _error = (sockaddr_in6 *)&res;
  string_ftpport = (char *)0x0;
  dns_entry = (Curl_dns_entry *)(_result->set).str[0x24];
  pCStack_540 = (Curl_dns_entry *)0x0;
  buffer[0xfe] = '\0';
  buffer[0xff] = '\0';
  buffer[0xfc] = '\0';
  buffer[0xfd] = '\0';
  buffer[0xf9] = '\x01';
  addrlen = 0;
  local_658 = 0;
  sa6 = _error;
  sa4 = (sockaddr_in *)_error;
  if (((_result->set).str[0x24] != (char *)0x0) &&
     (sVar7 = strlen((_result->set).str[0x24]), 1 < sVar7)) {
    if (*(char *)&dns_entry->addr == '[') {
      pcVar8 = (char *)((long)&dns_entry->addr + 1);
      ip_start = strchr(pcVar8,0x5d);
      if (ip_start != (char *)0x0) {
        local_658 = (long)ip_start - (long)pcVar8;
        addrlen = (size_t)pcVar8;
      }
    }
    else if (*(char *)&dns_entry->addr == ':') {
      ip_start = (char *)dns_entry;
    }
    else {
      ip_start = strchr((char *)dns_entry,0x3a);
      addrlen = (size_t)dns_entry;
      if (ip_start == (char *)0x0) {
        local_658 = strlen((char *)dns_entry);
      }
      else {
        local_658 = (long)ip_start - (long)dns_entry;
        iVar5 = inet_pton(10,(char *)dns_entry,&_error->sin6_addr);
        if (iVar5 == 1) {
          buffer[0xfc] = '\0';
          buffer[0xfd] = '\0';
          buffer[0xfe] = '\0';
          buffer[0xff] = '\0';
          ip_start = (char *)0x0;
        }
      }
    }
    if ((ip_start != (char *)0x0) && (pcVar8 = strchr(ip_start,0x3a), pcVar8 != (char *)0x0)) {
      uVar9 = strtoul(pcVar8 + 1,(char **)0x0,10);
      buffer._254_2_ = curlx_ultous(uVar9);
      pcVar8 = strchr(pcVar8,0x2d);
      if (pcVar8 == (char *)0x0) {
        buffer[0xfc] = buffer[0xfe];
        buffer[0xfd] = buffer[0xff];
      }
      else {
        uVar9 = strtoul(pcVar8 + 1,(char **)0x0,10);
        buffer._252_2_ = curlx_ultous(uVar9);
      }
    }
    if ((ushort)buffer._252_2_ < (ushort)buffer._254_2_) {
      buffer[0xfc] = '\0';
      buffer[0xfd] = '\0';
      buffer[0xfe] = '\0';
      buffer[0xff] = '\0';
    }
    if (local_658 == 0) {
      string_ftpport = (char *)0x0;
    }
    else {
      if (0x31 < local_658) goto LAB_0013ed1d;
      memcpy(&ip_end,(void *)addrlen,local_658);
      ipstr[local_658 - 8] = '\0';
      piVar10 = (int *)(ftpc->pp).sendbuf.allc;
      iVar5 = *piVar10;
      remote_scope = Curl_ipv6_scope((sockaddr *)(piVar10 + 4));
      iVar4 = Curl_if2ip(iVar5,remote_scope,(uint)ftpc[5].pp.nread_resp,(char *)&ip_end,(char *)&sa,
                         0x401);
      if (iVar4 == IF2IP_NOT_FOUND) {
        string_ftpport = (char *)&ip_end;
      }
      else {
        if (iVar4 == IF2IP_AF_NOT_SUPPORTED) goto LAB_0013ed1d;
        if (iVar4 == IF2IP_FOUND) {
          string_ftpport = (char *)&sa;
        }
      }
    }
  }
  if (string_ftpport == (char *)0x0) {
    local_fc = 0x80;
    iVar5 = getsockname(*(int *)&ftpc[2].pp.pending_resp,(sockaddr *)sa4,&local_fc);
    pCVar2 = _result;
    if (iVar5 != 0) {
      piVar10 = __errno_location();
      pcVar8 = Curl_strerror(*piVar10,(char *)&addr,0x100);
      Curl_failf(pCVar2,"getsockname() failed: %s",pcVar8);
      goto LAB_0013ed1d;
    }
    if (sa4->sin_family == 10) {
      local_6c0 = inet_ntop((uint)sa4->sin_family,&_error->sin6_addr,(char *)&sa,0x401);
    }
    else {
      local_6c0 = inet_ntop((uint)sa4->sin_family,&sa6->sin6_flowinfo,(char *)&sa,0x401);
    }
    if (local_6c0 == (char *)0x0) goto LAB_0013ed1d;
    string_ftpport = (char *)&sa;
    buffer[0xf9] = '\0';
  }
  host._4_4_ = Curl_resolv(_result,string_ftpport,0,false,&stack0xfffffffffffffac0);
  if (host._4_4_ == CURLRESOLV_PENDING) {
    Curl_resolver_wait_resolv(_result,&stack0xfffffffffffffac0);
  }
  if (pCStack_540 == (Curl_dns_entry *)0x0) {
    ai = (Curl_addrinfo *)0x0;
  }
  else {
    ai = pCStack_540->addr;
  }
  if (ai == (Curl_addrinfo *)0x0) {
    Curl_failf(_result,"failed to resolve the address provided to PORT: %s",string_ftpport);
  }
  else {
    string_ftpport = (char *)0x0;
    host._0_4_ = 0;
    pCStack_f8 = ai;
    while ((pCStack_f8 != (Curl_addrinfo *)0x0 &&
           (CVar6 = Curl_socket_open(_result,pCStack_f8,(Curl_sockaddr_ex *)0x0,
                                     (uint)(byte)ftpc[5].pp.field_0xa,&local_2c), CVar6 != CURLE_OK)
           )) {
      piVar10 = __errno_location();
      host._0_4_ = *piVar10;
      pCStack_f8 = pCStack_f8->ai_next;
    }
    pCVar2 = _result;
    if (pCStack_f8 == (Curl_addrinfo *)0x0) {
      pcVar8 = Curl_strerror((int)host,(char *)&addr,0x100);
      Curl_failf(pCVar2,"socket failure: %s",pcVar8);
    }
    else {
      if ((((_result != (Curl_easy *)0x0) &&
           ((*(ulong *)&(_result->set).field_0x8ca >> 0x1c & 1) != 0)) &&
          (((_result->state).feat == (curl_trc_feat *)0x0 ||
           (0 < ((_result->state).feat)->log_level)))) && (0 < Curl_trc_feat_ftp.log_level)) {
        if ((_result == (Curl_easy *)0x0) || (_result->conn == (connectdata *)0x0)) {
          local_770 = "???";
        }
        else {
          local_770 = ftp_state_names[(_result->conn->proto).ftpc.state];
        }
        Curl_trc_ftp(_result,"[%s] ftp_state_use_port(), opened socket",local_770);
      }
      memcpy(sa4,pCStack_f8->ai_addr,(ulong)pCStack_f8->ai_addrlen);
      local_fc = pCStack_f8->ai_addrlen;
      buffer[0xfa] = buffer[0xfe];
      buffer[0xfb] = buffer[0xff];
      while ((ushort)buffer._250_2_ <= (ushort)buffer._252_2_) {
        if (sa4->sin_family == 2) {
          uVar3 = htons(buffer._250_2_);
          sa6->sin6_port = uVar3;
        }
        else {
          uVar3 = htons(buffer._250_2_);
          _error->sin6_port = uVar3;
        }
        iVar5 = bind(local_2c,(sockaddr *)sa4,local_fc);
        if (iVar5 == 0) break;
        piVar10 = __errno_location();
        pCVar2 = _result;
        uVar1 = buffer._250_2_;
        host._0_4_ = *piVar10;
        if (((buffer[0xf9] & 1U) == 0) || ((int)host != 99)) {
          if (((int)host != 0x62) && ((int)host != 0xd)) {
            pcVar8 = Curl_strerror((int)host,(char *)&addr,0x100);
            Curl_failf(pCVar2,"bind(port=%hu) failed: %s",(ulong)(ushort)uVar1,pcVar8);
            goto LAB_0013ed1d;
          }
          buffer._250_2_ = buffer._250_2_ + 1;
        }
        else {
          if (((_result != (Curl_easy *)0x0) &&
              ((*(ulong *)&(_result->set).field_0x8ca >> 0x1c & 1) != 0)) &&
             (((_result->state).feat == (curl_trc_feat *)0x0 ||
              (0 < ((_result->state).feat)->log_level)))) {
            pcVar8 = Curl_strerror(99,(char *)&addr,0x100);
            Curl_infof(pCVar2,"bind(port=%hu) on non-local address failed: %s",(ulong)(ushort)uVar1,
                       pcVar8);
          }
          local_fc = 0x80;
          iVar5 = getsockname(*(int *)&ftpc[2].pp.pending_resp,(sockaddr *)sa4,&local_fc);
          pCVar2 = _result;
          if (iVar5 != 0) {
            piVar10 = __errno_location();
            pcVar8 = Curl_strerror(*piVar10,(char *)&addr,0x100);
            Curl_failf(pCVar2,"getsockname() failed: %s",pcVar8);
            goto LAB_0013ed1d;
          }
          buffer[0xfa] = buffer[0xfe];
          buffer[0xfb] = buffer[0xff];
          buffer[0xf9] = '\0';
        }
      }
      if ((ushort)buffer._252_2_ < (ushort)buffer._250_2_) {
        Curl_failf(_result,"bind() failed, we ran out of ports");
      }
      else {
        local_fc = 0x80;
        stack0xfffffffffffff920 = sa4;
        iVar5 = getsockname(local_2c,(sockaddr *)sa4,&local_fc);
        pCVar2 = _result;
        if (iVar5 == 0) {
          if (((_result != (Curl_easy *)0x0) &&
              ((*(ulong *)&(_result->set).field_0x8ca >> 0x1c & 1) != 0)) &&
             ((((_result->state).feat == (curl_trc_feat *)0x0 ||
               (0 < ((_result->state).feat)->log_level)) && (0 < Curl_trc_feat_ftp.log_level)))) {
            if ((_result == (Curl_easy *)0x0) || (_result->conn == (connectdata *)0x0)) {
              local_7b0 = "???";
            }
            else {
              local_7b0 = ftp_state_names[(_result->conn->proto).ftpc.state];
            }
            Curl_trc_ftp(_result,"[%s] ftp_state_use_port(), socket bound to port %d",local_7b0,
                         (ulong)(ushort)buffer._250_2_);
          }
          iVar5 = listen(local_2c,1);
          pCVar2 = _result;
          if (iVar5 == 0) {
            if ((((_result != (Curl_easy *)0x0) &&
                 ((*(ulong *)&(_result->set).field_0x8ca >> 0x1c & 1) != 0)) &&
                (((_result->state).feat == (curl_trc_feat *)0x0 ||
                 (0 < ((_result->state).feat)->log_level)))) && (0 < Curl_trc_feat_ftp.log_level)) {
              if ((_result == (Curl_easy *)0x0) || (_result->conn == (connectdata *)0x0)) {
                local_7c8 = "???";
              }
              else {
                local_7c8 = ftp_state_names[(_result->conn->proto).ftpc.state];
              }
              Curl_trc_ftp(_result,"[%s] ftp_state_use_port(), listening on %d",local_7c8,
                           (ulong)(ushort)buffer._250_2_);
            }
            Curl_printable_address(pCStack_f8,(char *)&ss.buffer.sa_stor.__ss_align,0x2f);
            if (((ftpc[3].pp.recvbuf.allc >> 0x10 & 1) == 0) &&
               ((ftpc[3].pp.recvbuf.allc >> 0xb & 1) != 0)) {
              ftpc[3].pp.recvbuf.allc = ftpc[3].pp.recvbuf.allc & 0xfffffffffffeffff | 0x10000;
            }
            conn._0_4_ = Curl_conn_tcp_listen_set(_result,(connectdata *)ftpc,1,&local_2c);
            if ((CURLcode)conn == CURLE_OK) {
              local_2c = -1;
LAB_0013ea88:
              if (conn._4_4_ == DONE) goto LAB_0013ed02;
              if ((((ftpc[3].pp.recvbuf.allc & 0x10000) != 0) || (conn._4_4_ != EPRT)) &&
                 ((conn._4_4_ != PORT || (sa4->sin_family == 2)))) {
                if (sa4->sin_family == 2) {
                  buffer._250_2_ = ntohs(sa6->sin6_port);
                }
                else {
                  if (sa4->sin_family != 10) goto LAB_0013ecf4;
                  buffer._250_2_ = ntohs(_error->sin6_port);
                }
                if (conn._4_4_ == EPRT) {
                  uVar11 = 2;
                  if (sa4->sin_family == 2) {
                    uVar11 = 1;
                  }
                  conn._0_4_ = Curl_pp_sendf(_result,ppStack_28,"%s |%d|%s|%hu|",
                                             ftp_state_use_port::mode,uVar11,
                                             (undefined1 *)((long)&ss.buffer + 0x78),
                                             (uint)(ushort)buffer._250_2_);
                  pCVar2 = _result;
                  if ((CURLcode)conn != CURLE_OK) {
                    pcVar8 = curl_easy_strerror((CURLcode)conn);
                    Curl_failf(pCVar2,"Failure sending EPRT command: %s",pcVar8);
                    goto LAB_0013ed1d;
                  }
                  goto LAB_0013ed02;
                }
                if (conn._4_4_ == PORT) {
                  local_738 = &source;
                  for (dest = (char *)&ss.buffer.sa_stor.__ss_align; *dest != '\0'; dest = dest + 1)
                  {
                    if (*dest == '.') {
                      *(undefined1 *)local_738 = 0x2c;
                    }
                    else {
                      *(char *)local_738 = *dest;
                    }
                    local_738 = (char **)((long)local_738 + 1);
                  }
                  *(undefined1 *)local_738 = 0;
                  curl_msnprintf((char *)local_738,0x14,",%d,%d",
                                 (ulong)(uint)((int)(uint)(ushort)buffer._250_2_ >> 8),
                                 (ulong)((ushort)buffer._250_2_ & 0xff));
                  conn._0_4_ = Curl_pp_sendf(_result,ppStack_28,"%s %s",
                                             ftp_state_use_port::mode + conn._4_4_,&source);
                  pCVar2 = _result;
                  if ((CURLcode)conn == CURLE_OK) {
LAB_0013ed02:
                    *(ftpport *)&ppStack_28[1].recvbuf.bufr = conn._4_4_;
                    _ftp_state(_result,'\x1c');
                    goto LAB_0013ed1d;
                  }
                  pcVar8 = curl_easy_strerror((CURLcode)conn);
                  Curl_failf(pCVar2,"Failure sending PORT command: %s",pcVar8);
                  goto LAB_0013ed1d;
                }
              }
LAB_0013ecf4:
              conn._4_4_ = conn._4_4_ + PORT;
              goto LAB_0013ea88;
            }
          }
          else {
            piVar10 = __errno_location();
            pcVar8 = Curl_strerror(*piVar10,(char *)&addr,0x100);
            Curl_failf(pCVar2,"socket failure: %s",pcVar8);
          }
        }
        else {
          piVar10 = __errno_location();
          pcVar8 = Curl_strerror(*piVar10,(char *)&addr,0x100);
          Curl_failf(pCVar2,"getsockname() failed: %s",pcVar8);
        }
      }
    }
  }
LAB_0013ed1d:
  if (pCStack_540 != (Curl_dns_entry *)0x0) {
    Curl_resolv_unlink(_result,&stack0xfffffffffffffac0);
  }
  if ((CURLcode)conn != CURLE_OK) {
    _ftp_state(_result,'\0');
  }
  if (local_2c != -1) {
    Curl_socket_close(_result,(connectdata *)ftpc,local_2c);
  }
  return (CURLcode)conn;
}

Assistant:

static CURLcode ftp_state_use_port(struct Curl_easy *data,
                                   ftpport fcmd) /* start with this */
{
  CURLcode result = CURLE_FTP_PORT_FAILED;
  struct connectdata *conn = data->conn;
  struct ftp_conn *ftpc = &conn->proto.ftpc;
  curl_socket_t portsock = CURL_SOCKET_BAD;
  char myhost[MAX_IPADR_LEN + 1] = "";

  struct Curl_sockaddr_storage ss;
  struct Curl_addrinfo *res, *ai;
  curl_socklen_t sslen;
  char hbuf[NI_MAXHOST];
  struct sockaddr *sa = (struct sockaddr *)&ss;
  struct sockaddr_in * const sa4 = (void *)sa;
#ifdef USE_IPV6
  struct sockaddr_in6 * const sa6 = (void *)sa;
#endif
  static const char mode[][5] = { "EPRT", "PORT" };
  enum resolve_t rc;
  int error;
  char *host = NULL;
  char *string_ftpport = data->set.str[STRING_FTPPORT];
  struct Curl_dns_entry *dns_entry = NULL;
  unsigned short port_min = 0;
  unsigned short port_max = 0;
  unsigned short port;
  bool possibly_non_local = TRUE;
  char buffer[STRERROR_LEN];
  char *addr = NULL;
  size_t addrlen = 0;
  char ipstr[50];

  /* Step 1, figure out what is requested,
   * accepted format :
   * (ipv4|ipv6|domain|interface)?(:port(-range)?)?
   */

  if(data->set.str[STRING_FTPPORT] &&
     (strlen(data->set.str[STRING_FTPPORT]) > 1)) {
    char *ip_end = NULL;

#ifdef USE_IPV6
    if(*string_ftpport == '[') {
      /* [ipv6]:port(-range) */
      char *ip_start = string_ftpport + 1;
      ip_end = strchr(ip_start, ']');
      if(ip_end) {
        addrlen = ip_end - ip_start;
        addr = ip_start;
      }
    }
    else
#endif
      if(*string_ftpport == ':') {
        /* :port */
        ip_end = string_ftpport;
      }
      else {
        ip_end = strchr(string_ftpport, ':');
        addr = string_ftpport;
        if(ip_end) {
          /* either ipv6 or (ipv4|domain|interface):port(-range) */
          addrlen = ip_end - string_ftpport;
#ifdef USE_IPV6
          if(Curl_inet_pton(AF_INET6, string_ftpport, &sa6->sin6_addr) == 1) {
            /* ipv6 */
            port_min = port_max = 0;
            ip_end = NULL; /* this got no port ! */
          }
#endif
        }
        else
          /* ipv4|interface */
          addrlen = strlen(string_ftpport);
      }

    /* parse the port */
    if(ip_end) {
      char *port_sep = NULL;
      char *port_start = strchr(ip_end, ':');
      if(port_start) {
        port_min = curlx_ultous(strtoul(port_start + 1, NULL, 10));
        port_sep = strchr(port_start, '-');
        if(port_sep) {
          port_max = curlx_ultous(strtoul(port_sep + 1, NULL, 10));
        }
        else
          port_max = port_min;
      }
    }

    /* correct errors like:
     *  :1234-1230
     *  :-4711,  in this case port_min is (unsigned)-1,
     *           therefore port_min > port_max for all cases
     *           but port_max = (unsigned)-1
     */
    if(port_min > port_max)
      port_min = port_max = 0;

    if(addrlen) {
      DEBUGASSERT(addr);
      if(addrlen >= sizeof(ipstr))
        goto out;
      memcpy(ipstr, addr, addrlen);
      ipstr[addrlen] = 0;

      /* attempt to get the address of the given interface name */
      switch(Curl_if2ip(conn->remote_addr->family,
#ifdef USE_IPV6
                        Curl_ipv6_scope(&conn->remote_addr->curl_sa_addr),
                        conn->scope_id,
#endif
                        ipstr, hbuf, sizeof(hbuf))) {
        case IF2IP_NOT_FOUND:
          /* not an interface, use the given string as hostname instead */
          host = ipstr;
          break;
        case IF2IP_AF_NOT_SUPPORTED:
          goto out;
        case IF2IP_FOUND:
          host = hbuf; /* use the hbuf for hostname */
          break;
      }
    }
    else
      /* there was only a port(-range) given, default the host */
      host = NULL;
  } /* data->set.ftpport */

  if(!host) {
    const char *r;
    /* not an interface and not a hostname, get default by extracting
       the IP from the control connection */
    sslen = sizeof(ss);
    if(getsockname(conn->sock[FIRSTSOCKET], sa, &sslen)) {
      failf(data, "getsockname() failed: %s",
            Curl_strerror(SOCKERRNO, buffer, sizeof(buffer)));
      goto out;
    }
    switch(sa->sa_family) {
#ifdef USE_IPV6
    case AF_INET6:
      r = Curl_inet_ntop(sa->sa_family, &sa6->sin6_addr, hbuf, sizeof(hbuf));
      break;
#endif
    default:
      r = Curl_inet_ntop(sa->sa_family, &sa4->sin_addr, hbuf, sizeof(hbuf));
      break;
    }
    if(!r) {
      goto out;
    }
    host = hbuf; /* use this hostname */
    possibly_non_local = FALSE; /* we know it is local now */
  }

  /* resolv ip/host to ip */
  rc = Curl_resolv(data, host, 0, FALSE, &dns_entry);
  if(rc == CURLRESOLV_PENDING)
    (void)Curl_resolver_wait_resolv(data, &dns_entry);
  if(dns_entry) {
    res = dns_entry->addr;
  }
  else
    res = NULL; /* failure! */

  if(!res) {
    failf(data, "failed to resolve the address provided to PORT: %s", host);
    goto out;
  }

  host = NULL;

  /* step 2, create a socket for the requested address */
  error = 0;
  for(ai = res; ai; ai = ai->ai_next) {
    if(Curl_socket_open(data, ai, NULL, conn->transport, &portsock)) {
      error = SOCKERRNO;
      continue;
    }
    break;
  }
  if(!ai) {
    failf(data, "socket failure: %s",
          Curl_strerror(error, buffer, sizeof(buffer)));
    goto out;
  }
  CURL_TRC_FTP(data, "[%s] ftp_state_use_port(), opened socket",
               FTP_DSTATE(data));

  /* step 3, bind to a suitable local address */

  memcpy(sa, ai->ai_addr, ai->ai_addrlen);
  sslen = ai->ai_addrlen;

  for(port = port_min; port <= port_max;) {
    if(sa->sa_family == AF_INET)
      sa4->sin_port = htons(port);
#ifdef USE_IPV6
    else
      sa6->sin6_port = htons(port);
#endif
    /* Try binding the given address. */
    if(bind(portsock, sa, sslen) ) {
      /* It failed. */
      error = SOCKERRNO;
      if(possibly_non_local && (error == EADDRNOTAVAIL)) {
        /* The requested bind address is not local. Use the address used for
         * the control connection instead and restart the port loop
         */
        infof(data, "bind(port=%hu) on non-local address failed: %s", port,
              Curl_strerror(error, buffer, sizeof(buffer)));

        sslen = sizeof(ss);
        if(getsockname(conn->sock[FIRSTSOCKET], sa, &sslen)) {
          failf(data, "getsockname() failed: %s",
                Curl_strerror(SOCKERRNO, buffer, sizeof(buffer)));
          goto out;
        }
        port = port_min;
        possibly_non_local = FALSE; /* do not try this again */
        continue;
      }
      if(error != EADDRINUSE && error != EACCES) {
        failf(data, "bind(port=%hu) failed: %s", port,
              Curl_strerror(error, buffer, sizeof(buffer)));
        goto out;
      }
    }
    else
      break;

    port++;
  }

  /* maybe all ports were in use already */
  if(port > port_max) {
    failf(data, "bind() failed, we ran out of ports");
    goto out;
  }

  /* get the name again after the bind() so that we can extract the
     port number it uses now */
  sslen = sizeof(ss);
  if(getsockname(portsock, sa, &sslen)) {
    failf(data, "getsockname() failed: %s",
          Curl_strerror(SOCKERRNO, buffer, sizeof(buffer)));
    goto out;
  }
  CURL_TRC_FTP(data, "[%s] ftp_state_use_port(), socket bound to port %d",
               FTP_DSTATE(data), port);

  /* step 4, listen on the socket */

  if(listen(portsock, 1)) {
    failf(data, "socket failure: %s",
          Curl_strerror(SOCKERRNO, buffer, sizeof(buffer)));
    goto out;
  }
  CURL_TRC_FTP(data, "[%s] ftp_state_use_port(), listening on %d",
               FTP_DSTATE(data), port);

  /* step 5, send the proper FTP command */

  /* get a plain printable version of the numerical address to work with
     below */
  Curl_printable_address(ai, myhost, sizeof(myhost));

#ifdef USE_IPV6
  if(!conn->bits.ftp_use_eprt && conn->bits.ipv6)
    /* EPRT is disabled but we are connected to a IPv6 host, so we ignore the
       request and enable EPRT again! */
    conn->bits.ftp_use_eprt = TRUE;
#endif

  /* Replace any filter on SECONDARY with one listening on this socket */
  result = Curl_conn_tcp_listen_set(data, conn, SECONDARYSOCKET, &portsock);
  if(result)
    goto out;
  portsock = CURL_SOCKET_BAD; /* now held in filter */

  for(; fcmd != DONE; fcmd++) {

    if(!conn->bits.ftp_use_eprt && (EPRT == fcmd))
      /* if disabled, goto next */
      continue;

    if((PORT == fcmd) && sa->sa_family != AF_INET)
      /* PORT is IPv4 only */
      continue;

    switch(sa->sa_family) {
    case AF_INET:
      port = ntohs(sa4->sin_port);
      break;
#ifdef USE_IPV6
    case AF_INET6:
      port = ntohs(sa6->sin6_port);
      break;
#endif
    default:
      continue; /* might as well skip this */
    }

    if(EPRT == fcmd) {
      /*
       * Two fine examples from RFC2428;
       *
       * EPRT |1|132.235.1.2|6275|
       *
       * EPRT |2|1080::8:800:200C:417A|5282|
       */

      result = Curl_pp_sendf(data, &ftpc->pp, "%s |%d|%s|%hu|", mode[fcmd],
                             sa->sa_family == AF_INET ? 1 : 2,
                             myhost, port);
      if(result) {
        failf(data, "Failure sending EPRT command: %s",
              curl_easy_strerror(result));
        goto out;
      }
      break;
    }
    if(PORT == fcmd) {
      /* large enough for [IP address],[num],[num] */
      char target[sizeof(myhost) + 20];
      char *source = myhost;
      char *dest = target;

      /* translate x.x.x.x to x,x,x,x */
      while(*source) {
        if(*source == '.')
          *dest = ',';
        else
          *dest = *source;
        dest++;
        source++;
      }
      *dest = 0;
      msnprintf(dest, 20, ",%d,%d", (int)(port >> 8), (int)(port & 0xff));

      result = Curl_pp_sendf(data, &ftpc->pp, "%s %s", mode[fcmd], target);
      if(result) {
        failf(data, "Failure sending PORT command: %s",
              curl_easy_strerror(result));
        goto out;
      }
      break;
    }
  }

  /* store which command was sent */
  ftpc->count1 = fcmd;

  ftp_state(data, FTP_PORT);

out:
  /* If we looked up a dns_entry, now is the time to safely release it */
  if(dns_entry)
    Curl_resolv_unlink(data, &dns_entry);
  if(result) {
    ftp_state(data, FTP_STOP);
  }
  if(portsock != CURL_SOCKET_BAD)
    Curl_socket_close(data, conn, portsock);
  return result;
}